

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O0

BOOL __thiscall
Js::GlobalObject::DeleteItem(GlobalObject *this,uint32 index,PropertyOperationFlags flags)

{
  BOOL BVar1;
  RecyclableObject **ppRVar2;
  RecyclableObject *pRVar3;
  HostObjectBase **ppHVar4;
  HostObjectBase *pHVar5;
  PropertyOperationFlags flags_local;
  uint32 index_local;
  GlobalObject *this_local;
  
  BVar1 = DynamicObject::DeleteItem((DynamicObject *)this,index,flags);
  if (BVar1 == 0) {
    ppRVar2 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                        ((WriteBarrierPtr *)&this->directHostObject);
    if (*ppRVar2 == (RecyclableObject *)0x0) {
      ppHVar4 = Memory::WriteBarrierPtr::operator_cast_to_HostObjectBase__
                          ((WriteBarrierPtr *)&(this->super_RootObjectBase).hostObject);
      if (*ppHVar4 == (HostObjectBase *)0x0) {
        this_local._4_4_ = 0;
      }
      else {
        pHVar5 = Memory::WriteBarrierPtr<Js::HostObjectBase>::operator->
                           (&(this->super_RootObjectBase).hostObject);
        this_local._4_4_ = (**(code **)(*(long *)pHVar5 + 0x150))(pHVar5,index,flags);
      }
    }
    else {
      pRVar3 = Memory::WriteBarrierPtr<Js::RecyclableObject>::operator->(&this->directHostObject);
      this_local._4_4_ =
           (*(pRVar3->super_FinalizableObject).super_IRecyclerVisitedObject.
             _vptr_IRecyclerVisitedObject[0x2a])(pRVar3,(ulong)index,(ulong)flags);
    }
  }
  else {
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

BOOL GlobalObject::DeleteItem(uint32 index, PropertyOperationFlags flags)
    {
        if (DynamicObject::DeleteItem(index, flags))
        {
            return TRUE;
        }

        if (this->directHostObject)
        {
            return this->directHostObject->DeleteItem(index, flags);
        }

        if (this->hostObject)
        {
            return this->hostObject->DeleteItem(index, flags);
        }
        return FALSE;
    }